

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O2

void Abs_ManFreeAray(Vec_Ptr_t *p)

{
  void *__ptr;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 < p->nSize; i_00 = i_00 + 1) {
    __ptr = Vec_PtrEntry(p,i_00);
    free(__ptr);
  }
  Vec_PtrFree(p);
  return;
}

Assistant:

void Abs_ManFreeAray( Vec_Ptr_t * p )
{
    void * pTemp;
    int i;
    Vec_PtrForEachEntry( void *, p, pTemp, i )
        ABC_FREE( pTemp );
    Vec_PtrFree( p );
}